

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O0

int AF_AActor_CheckBossDeath
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  AActor *actor;
  bool bVar1;
  bool local_47;
  int u;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0xd79,
                  "int AF_AActor_CheckBossDeath(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar1 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar1 = true, (param->field_0).field_1.atag != 1)) {
    bVar1 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar1) {
    actor = (AActor *)(param->field_0).field_1.a;
    local_47 = true;
    if (actor != (AActor *)0x0) {
      local_47 = DObject::IsKindOf((DObject *)actor,AActor::RegistrationInfo.MyClass);
    }
    if (local_47 != false) {
      bVar1 = CheckBossDeath(actor);
      if (numret < 1) {
        param_local._4_4_ = 0;
      }
      else {
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                        ,0xd7a,
                        "int AF_AActor_CheckBossDeath(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        VMReturn::SetInt(ret,(uint)bVar1);
        param_local._4_4_ = 1;
      }
      return param_local._4_4_;
    }
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0xd79,
                  "int AF_AActor_CheckBossDeath(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                ,0xd79,
                "int AF_AActor_CheckBossDeath(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, CheckBossDeath)
{
	PARAM_SELF_PROLOGUE(AActor);
	ACTION_RETURN_BOOL(CheckBossDeath(self));
}